

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

QItemViewPaintPairs * __thiscall
QAbstractItemViewPrivate::draggablePaintPairs
          (QItemViewPaintPairs *__return_storage_ptr__,QAbstractItemViewPrivate *this,
          QModelIndexList *indexes,QRect *r)

{
  long *plVar1;
  QWidgetData *pQVar2;
  char cVar3;
  int iVar4;
  int extraout_EDX;
  long lVar5;
  QModelIndex *index;
  QModelIndex *pQVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QItemViewPaintPair local_88;
  undefined1 local_58 [16];
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  local_48.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  local_48.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QItemViewPaintPair *)0x0;
  lVar5 = (indexes->d).size;
  if (lVar5 != 0) {
    pQVar6 = (indexes->d).ptr;
    lVar5 = lVar5 * 0x18;
    do {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (**(code **)(*plVar1 + 0x1e0))(plVar1,pQVar6);
      cVar3 = QRect::intersects((QRect *)local_58);
      if (cVar3 != '\0') {
        local_88.index.m.ptr = (pQVar6->m).ptr;
        local_88.index.r = pQVar6->r;
        local_88.index.c = pQVar6->c;
        local_88.index.i = pQVar6->i;
        local_88.rect = (QRect)local_58;
        QtPrivate::QMovableArrayOps<QItemViewPaintPair>::emplace<QItemViewPaintPair>
                  ((QMovableArrayOps<QItemViewPaintPair> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_88);
        QList<QItemViewPaintPair>::end(__return_storage_ptr__);
        QVar7 = (QRect)QRect::operator|(r,(QRect *)local_58);
        *r = QVar7;
      }
      pQVar6 = pQVar6 + 1;
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != 0);
  }
  iVar4 = QRect::operator&(r,&local_48);
  (r->x1).m_i = iVar4;
  (r->x2).m_i = extraout_EDX;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QItemViewPaintPairs QAbstractItemViewPrivate::draggablePaintPairs(const QModelIndexList &indexes, QRect *r) const
{
    Q_ASSERT(r);
    Q_Q(const QAbstractItemView);
    QRect &rect = *r;
    const QRect viewportRect = viewport->rect();
    QItemViewPaintPairs ret;
    for (const auto &index : indexes) {
        const QRect current = q->visualRect(index);
        if (current.intersects(viewportRect)) {
            ret.append({current, index});
            rect |= current;
        }
    }
    QRect clipped = rect & viewportRect;
    rect.setLeft(clipped.left());
    rect.setRight(clipped.right());
    return ret;
}